

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

ArgStatus despot::option::Arg::Required(Option *option,bool msg)

{
  if (option->arg != (char *)0x0 || !msg) {
    return (uint)(option->arg == (char *)0x0) * 2 + ARG_OK;
  }
  printError("Option \'",option,"\' requires an argument\n");
  exit(1);
}

Assistant:

static option::ArgStatus Required(const option::Option& option, bool msg) {
		if (option.arg != 0)
			return option::ARG_OK;
		if (msg) {
			printError("Option '", option, "' requires an argument\n");
			exit(1);
		}
		return option::ARG_ILLEGAL;
	}